

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
::occludedCoherent(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                   *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 in_EAX;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar18;
  code *pcVar20;
  NodeRef nodeRef;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  uint uVar61;
  uint uVar62;
  vint4 bi_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint uVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  uint uVar65;
  uint uVar66;
  float fVar76;
  float fVar79;
  vint4 ai;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar77;
  uint uVar78;
  uint uVar80;
  uint uVar81;
  float fVar82;
  uint uVar83;
  uint uVar84;
  float fVar85;
  undefined1 auVar75 [16];
  uint uVar86;
  float fVar87;
  float fVar96;
  uint uVar97;
  float fVar98;
  uint uVar99;
  float fVar100;
  vint4 ai_1;
  float fVar101;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar102;
  float fVar103;
  float fVar104;
  float fVar111;
  float fVar112;
  vint4 ai_3;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  vint4 ai_5;
  float fVar119;
  undefined1 auVar115 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  vint4 bi_4;
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vint4 bi_3;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  vint4 ai_4;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  vint<4> octant;
  vint4 bi_9;
  undefined1 local_11e8 [16];
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  int local_11c8;
  int iStack_11c4;
  int iStack_11c0;
  int iStack_11bc;
  undefined1 local_1168 [16];
  vint<4> *local_1150;
  undefined8 local_1148;
  undefined4 local_1140;
  StackItemMaskT<embree::NodeRefPtr<4>_> *local_1138;
  Intersectors *local_1130;
  undefined4 local_1128;
  uint local_1124;
  long local_1120;
  undefined8 local_1118;
  long local_1110;
  int local_1108;
  int iStack_1104;
  int iStack_1100;
  int iStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  uint local_1078;
  uint uStack_1074;
  uint uStack_1070;
  uint uStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [8];
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar19;
  
  auVar68._0_4_ = -(uint)(*(int *)this == -1);
  auVar68._4_4_ = -(uint)(*(int *)(this + 4) == -1);
  auVar68._8_4_ = -(uint)(*(int *)(this + 8) == -1);
  auVar68._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
  uVar15 = movmskps(in_EAX,auVar68);
  if (uVar15 == 0) {
    return;
  }
  local_1108 = *(int *)this;
  iStack_1104 = *(int *)(this + 4);
  iStack_1100 = *(int *)(this + 8);
  iStack_10fc = *(int *)(this + 0xc);
  lVar2 = (valid_i->field_0).v[0];
  fVar136 = *(float *)&This->ptr;
  fVar137 = *(float *)((long)&This->ptr + 4);
  fVar138 = *(float *)&This->leafIntersector;
  fVar139 = *(float *)((long)&This->leafIntersector + 4);
  fVar140 = *(float *)&(This->collider).collide;
  fVar141 = *(float *)((long)&(This->collider).collide + 4);
  fVar142 = *(float *)&(This->collider).name;
  fVar143 = *(float *)((long)&(This->collider).name + 4);
  auVar70._0_8_ = (This->intersector4).intersect;
  auVar70._8_8_ = (This->intersector4).occluded;
  fVar96 = (float)((ulong)auVar70._0_8_ >> 0x20);
  fVar101 = (float)((ulong)auVar70._8_8_ >> 0x20);
  fVar121 = (float)DAT_01f80d30;
  fVar125 = DAT_01f80d30._4_4_;
  fVar127 = DAT_01f80d30._8_4_;
  fVar129 = DAT_01f80d30._12_4_;
  auVar106._4_4_ = -(uint)(ABS(fVar96) < fVar125);
  auVar106._0_4_ = -(uint)(ABS((float)auVar70._0_8_) < fVar121);
  auVar106._8_4_ = -(uint)(ABS((float)auVar70._8_8_) < fVar127);
  auVar106._12_4_ = -(uint)(ABS(fVar101) < fVar129);
  auVar130 = blendvps(auVar70,_DAT_01f80d30,auVar106);
  auVar106 = *(undefined1 (*) [16])&(This->intersector4).name;
  auVar134._4_4_ = -(uint)(ABS(auVar106._4_4_) < fVar125);
  auVar134._0_4_ = -(uint)(ABS(auVar106._0_4_) < fVar121);
  auVar134._8_4_ = -(uint)(ABS(auVar106._8_4_) < fVar127);
  auVar134._12_4_ = -(uint)(ABS(auVar106._12_4_) < fVar129);
  auVar134 = blendvps(auVar106,_DAT_01f80d30,auVar134);
  fVar144 = *(float *)&(This->intersector1).intersect;
  fVar145 = *(float *)((long)&(This->intersector1).intersect + 4);
  fVar146 = *(float *)&(This->intersector1).occluded;
  fVar147 = *(float *)((long)&(This->intersector1).occluded + 4);
  auVar123._0_8_ = (This->intersector4_filter).occluded;
  auVar123._8_8_ = (This->intersector4_filter).name;
  fVar116 = (float)((ulong)auVar123._0_8_ >> 0x20);
  fVar119 = (float)((ulong)auVar123._8_8_ >> 0x20);
  auVar132._4_4_ = -(uint)(ABS(fVar116) < fVar125);
  auVar132._0_4_ = -(uint)(ABS((float)auVar123._0_8_) < fVar121);
  auVar132._8_4_ = -(uint)(ABS((float)auVar123._8_8_) < fVar127);
  auVar132._12_4_ = -(uint)(ABS(fVar119) < fVar129);
  auVar135 = blendvps(auVar123,_DAT_01f80d30,auVar132);
  auVar67._0_8_ = (This->intersector1).pointQuery;
  auVar67._8_8_ = (This->intersector1).name;
  auVar33 = rcpps(auVar132,auVar130);
  fVar148 = auVar33._0_4_;
  fVar149 = auVar33._4_4_;
  fVar150 = auVar33._8_4_;
  fVar151 = auVar33._12_4_;
  fVar148 = (1.0 - auVar130._0_4_ * fVar148) * fVar148 + fVar148;
  fVar149 = (1.0 - auVar130._4_4_ * fVar149) * fVar149 + fVar149;
  fVar150 = (1.0 - auVar130._8_4_ * fVar150) * fVar150 + fVar150;
  fVar151 = (1.0 - auVar130._12_4_ * fVar151) * fVar151 + fVar151;
  auVar33 = rcpps(auVar33,auVar134);
  fVar121 = auVar33._0_4_;
  fVar125 = auVar33._4_4_;
  fVar127 = auVar33._8_4_;
  fVar129 = auVar33._12_4_;
  local_10e8._0_8_ =
       CONCAT44((1.0 - auVar134._4_4_ * fVar125) * fVar125 + fVar125,
                (1.0 - auVar134._0_4_ * fVar121) * fVar121 + fVar121);
  local_10e8._8_4_ = (1.0 - auVar134._8_4_ * fVar127) * fVar127 + fVar127;
  local_10e8._12_4_ = (1.0 - auVar134._12_4_ * fVar129) * fVar129 + fVar129;
  auVar33 = rcpps(auVar33,auVar135);
  fVar121 = auVar33._0_4_;
  fVar125 = auVar33._4_4_;
  fVar127 = auVar33._8_4_;
  fVar129 = auVar33._12_4_;
  auVar130._8_4_ = local_10e8._8_4_;
  auVar130._0_8_ = local_10e8._0_8_;
  auVar130._12_4_ = local_10e8._12_4_;
  fVar121 = (1.0 - auVar135._0_4_ * fVar121) * fVar121 + fVar121;
  fVar125 = (1.0 - auVar135._4_4_ * fVar125) * fVar125 + fVar125;
  fVar127 = (1.0 - auVar135._8_4_ * fVar127) * fVar127 + fVar127;
  fVar129 = (1.0 - auVar135._12_4_ * fVar129) * fVar129 + fVar129;
  auVar135._0_12_ = ZEXT812(0);
  auVar135._12_4_ = 0;
  auVar67 = maxps(auVar67,auVar135);
  local_10f8 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar135);
  auVar33._8_4_ = 0xffffffff;
  auVar33._0_8_ = 0xffffffffffffffff;
  auVar33._12_4_ = 0xffffffff;
  local_1088 = auVar68 ^ auVar33;
  auVar88._0_8_ = CONCAT44(-(uint)(fVar96 < 0.0),-(uint)((float)auVar70._0_8_ < 0.0)) & 0x100000001;
  auVar88._8_4_ = -(uint)((float)auVar70._8_8_ < 0.0) & 1;
  auVar88._12_4_ = -(uint)(fVar101 < 0.0) & 1;
  auVar105._0_8_ =
       CONCAT44(-(uint)(auVar106._4_4_ < 0.0),-(uint)(auVar106._0_4_ < 0.0)) & 0x200000002;
  auVar105._8_4_ = -(uint)(auVar106._8_4_ < 0.0) & 2;
  auVar105._12_4_ = -(uint)(auVar106._12_4_ < 0.0) & 2;
  auVar115._0_8_ =
       CONCAT44(-(uint)(fVar116 < 0.0),-(uint)((float)auVar123._0_8_ < 0.0)) & 0x400000004;
  auVar115._8_4_ = -(uint)((float)auVar123._8_8_ < 0.0) & 4;
  auVar115._12_4_ = -(uint)(fVar119 < 0.0) & 4;
  local_1168 = auVar115 | local_1088 | auVar105 | auVar88;
  _local_1078 = mm_lookupmask_ps._0_8_;
  _uStack_1070 = mm_lookupmask_ps._8_8_;
  local_1098 = fVar136;
  fStack_1094 = fVar137;
  fStack_1090 = fVar138;
  fStack_108c = fVar139;
  local_10a8 = fVar140;
  fStack_10a4 = fVar141;
  fStack_10a0 = fVar142;
  fStack_109c = fVar143;
  local_10b8 = fVar144;
  fStack_10b4 = fVar145;
  fStack_10b0 = fVar146;
  fStack_10ac = fVar147;
  local_10c8 = fVar121;
  fStack_10c4 = fVar125;
  fStack_10c0 = fVar127;
  fStack_10bc = fVar129;
  local_10d8 = fVar148;
  fStack_10d4 = fVar149;
  fStack_10d0 = fVar150;
  fStack_10cc = fVar151;
  pBVar19 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
             *)(ulong)(uVar15 & 0xff);
LAB_00294d36:
  lVar3 = 0;
  if (pBVar19 !=
      (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
       *)0x0) {
    for (; ((ulong)pBVar19 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
    }
  }
  iVar16 = *(int *)(local_1168 + lVar3 * 4);
  local_11e8._0_8_ =
       CONCAT44(-(uint)(iVar16 == local_1168._4_4_),-(uint)(iVar16 == local_1168._0_4_));
  local_11e8._8_4_ = -(uint)(iVar16 == local_1168._8_4_);
  local_11e8._12_4_ = -(uint)(iVar16 == local_1168._12_4_);
  uVar24 = movmskps((int)this,local_11e8);
  stack[0].mask = CONCAT44((int)((ulong)this >> 0x20),uVar24);
  stack[0].ptr.ptr = *(size_t *)(lVar2 + 0x70);
  auVar34._8_4_ = local_11e8._8_4_;
  auVar34._0_8_ = local_11e8._0_8_;
  auVar34._12_4_ = local_11e8._12_4_;
  auVar5._4_4_ = fVar137;
  auVar5._0_4_ = fVar136;
  auVar5._8_4_ = fVar138;
  auVar5._12_4_ = fVar139;
  auVar68 = blendvps(_DAT_01f7a9f0,auVar5,auVar34);
  pBVar25 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
             *)(~stack[0].mask & (ulong)pBVar19);
  auVar35._4_4_ = auVar68._0_4_;
  auVar35._0_4_ = auVar68._4_4_;
  auVar35._8_4_ = auVar68._12_4_;
  auVar35._12_4_ = auVar68._8_4_;
  auVar68 = minps(auVar35,auVar68);
  auVar69._0_8_ = auVar68._8_8_;
  auVar69._8_4_ = auVar68._0_4_;
  auVar69._12_4_ = auVar68._4_4_;
  auVar70 = minps(auVar69,auVar68);
  auVar36._8_4_ = local_11e8._8_4_;
  auVar36._0_8_ = local_11e8._0_8_;
  auVar36._12_4_ = local_11e8._12_4_;
  auVar7._4_4_ = fVar141;
  auVar7._0_4_ = fVar140;
  auVar7._8_4_ = fVar142;
  auVar7._12_4_ = fVar143;
  auVar68 = blendvps(_DAT_01f7a9f0,auVar7,auVar36);
  auVar37._4_4_ = auVar68._0_4_;
  auVar37._0_4_ = auVar68._4_4_;
  auVar37._8_4_ = auVar68._12_4_;
  auVar37._12_4_ = auVar68._8_4_;
  auVar68 = minps(auVar37,auVar68);
  auVar89._0_8_ = auVar68._8_8_;
  auVar89._8_4_ = auVar68._0_4_;
  auVar89._12_4_ = auVar68._4_4_;
  auVar68 = minps(auVar89,auVar68);
  auVar70 = insertps(auVar70,auVar68,0x1c);
  auVar38._8_4_ = local_11e8._8_4_;
  auVar38._0_8_ = local_11e8._0_8_;
  auVar38._12_4_ = local_11e8._12_4_;
  auVar9._4_4_ = fVar145;
  auVar9._0_4_ = fVar144;
  auVar9._8_4_ = fVar146;
  auVar9._12_4_ = fVar147;
  auVar68 = blendvps(_DAT_01f7a9f0,auVar9,auVar38);
  auVar39._4_4_ = auVar68._0_4_;
  auVar39._0_4_ = auVar68._4_4_;
  auVar39._8_4_ = auVar68._12_4_;
  auVar39._12_4_ = auVar68._8_4_;
  auVar68 = minps(auVar39,auVar68);
  auVar90._0_8_ = auVar68._8_8_;
  auVar90._8_4_ = auVar68._0_4_;
  auVar90._12_4_ = auVar68._4_4_;
  auVar68 = minps(auVar90,auVar68);
  auVar40._8_4_ = local_11e8._8_4_;
  auVar40._0_8_ = local_11e8._0_8_;
  auVar40._12_4_ = local_11e8._12_4_;
  auVar6._4_4_ = fVar137;
  auVar6._0_4_ = fVar136;
  auVar6._8_4_ = fVar138;
  auVar6._12_4_ = fVar139;
  auVar106 = blendvps(_DAT_01f7aa00,auVar6,auVar40);
  auVar123 = insertps(auVar70,auVar68,0x20);
  auVar41._4_4_ = auVar106._0_4_;
  auVar41._0_4_ = auVar106._4_4_;
  auVar41._8_4_ = auVar106._12_4_;
  auVar41._12_4_ = auVar106._8_4_;
  auVar68 = maxps(auVar41,auVar106);
  auVar91._0_8_ = auVar68._8_8_;
  auVar91._8_4_ = auVar68._0_4_;
  auVar91._12_4_ = auVar68._4_4_;
  auVar70 = maxps(auVar91,auVar68);
  auVar42._8_4_ = local_11e8._8_4_;
  auVar42._0_8_ = local_11e8._0_8_;
  auVar42._12_4_ = local_11e8._12_4_;
  auVar8._4_4_ = fVar141;
  auVar8._0_4_ = fVar140;
  auVar8._8_4_ = fVar142;
  auVar8._12_4_ = fVar143;
  auVar68 = blendvps(_DAT_01f7aa00,auVar8,auVar42);
  auVar43._4_4_ = auVar68._0_4_;
  auVar43._0_4_ = auVar68._4_4_;
  auVar43._8_4_ = auVar68._12_4_;
  auVar43._12_4_ = auVar68._8_4_;
  auVar68 = maxps(auVar43,auVar68);
  auVar92._0_8_ = auVar68._8_8_;
  auVar92._8_4_ = auVar68._0_4_;
  auVar92._12_4_ = auVar68._4_4_;
  auVar68 = maxps(auVar92,auVar68);
  auVar70 = insertps(auVar70,auVar68,0x1c);
  auVar44._8_4_ = local_11e8._8_4_;
  auVar44._0_8_ = local_11e8._0_8_;
  auVar44._12_4_ = local_11e8._12_4_;
  auVar10._4_4_ = fVar145;
  auVar10._0_4_ = fVar144;
  auVar10._8_4_ = fVar146;
  auVar10._12_4_ = fVar147;
  auVar68 = blendvps(_DAT_01f7aa00,auVar10,auVar44);
  auVar45._4_4_ = auVar68._0_4_;
  auVar45._0_4_ = auVar68._4_4_;
  auVar45._8_4_ = auVar68._12_4_;
  auVar45._12_4_ = auVar68._8_4_;
  auVar68 = maxps(auVar45,auVar68);
  auVar93._0_8_ = auVar68._8_8_;
  auVar93._8_4_ = auVar68._0_4_;
  auVar93._12_4_ = auVar68._4_4_;
  auVar68 = maxps(auVar93,auVar68);
  auVar46._8_4_ = local_11e8._8_4_;
  auVar46._0_8_ = local_11e8._0_8_;
  auVar46._12_4_ = local_11e8._12_4_;
  auVar13._4_4_ = fVar149;
  auVar13._0_4_ = fVar148;
  auVar13._8_4_ = fVar150;
  auVar13._12_4_ = fVar151;
  auVar106 = blendvps(_DAT_01f7a9f0,auVar13,auVar46);
  auVar33 = insertps(auVar70,auVar68,0x20);
  auVar47._4_4_ = auVar106._0_4_;
  auVar47._0_4_ = auVar106._4_4_;
  auVar47._8_4_ = auVar106._12_4_;
  auVar47._12_4_ = auVar106._8_4_;
  auVar68 = minps(auVar47,auVar106);
  auVar131._0_8_ = auVar68._8_8_;
  auVar131._8_4_ = auVar68._0_4_;
  auVar131._12_4_ = auVar68._4_4_;
  auVar70 = minps(auVar131,auVar68);
  auVar48._8_4_ = local_11e8._8_4_;
  auVar48._0_8_ = local_11e8._0_8_;
  auVar48._12_4_ = local_11e8._12_4_;
  auVar68 = blendvps(_DAT_01f7a9f0,auVar130,auVar48);
  auVar49._4_4_ = auVar68._0_4_;
  auVar49._0_4_ = auVar68._4_4_;
  auVar49._8_4_ = auVar68._12_4_;
  auVar49._12_4_ = auVar68._8_4_;
  auVar68 = minps(auVar49,auVar68);
  auVar94._0_8_ = auVar68._8_8_;
  auVar94._8_4_ = auVar68._0_4_;
  auVar94._12_4_ = auVar68._4_4_;
  auVar68 = minps(auVar94,auVar68);
  auVar106 = insertps(auVar70,auVar68,0x1c);
  auVar50._8_4_ = local_11e8._8_4_;
  auVar50._0_8_ = local_11e8._0_8_;
  auVar50._12_4_ = local_11e8._12_4_;
  auVar11._4_4_ = fVar125;
  auVar11._0_4_ = fVar121;
  auVar11._8_4_ = fVar127;
  auVar11._12_4_ = fVar129;
  auVar68 = blendvps(_DAT_01f7a9f0,auVar11,auVar50);
  auVar51._4_4_ = auVar68._0_4_;
  auVar51._0_4_ = auVar68._4_4_;
  auVar51._8_4_ = auVar68._12_4_;
  auVar51._12_4_ = auVar68._8_4_;
  auVar68 = minps(auVar51,auVar68);
  auVar95._0_8_ = auVar68._8_8_;
  auVar95._8_4_ = auVar68._0_4_;
  auVar95._12_4_ = auVar68._4_4_;
  auVar68 = minps(auVar95,auVar68);
  auVar52._8_4_ = local_11e8._8_4_;
  auVar52._0_8_ = local_11e8._0_8_;
  auVar52._12_4_ = local_11e8._12_4_;
  auVar14._4_4_ = fVar149;
  auVar14._0_4_ = fVar148;
  auVar14._8_4_ = fVar150;
  auVar14._12_4_ = fVar151;
  auVar70 = blendvps(_DAT_01f7aa00,auVar14,auVar52);
  auVar132 = insertps(auVar106,auVar68,0x20);
  auVar53._4_4_ = auVar70._0_4_;
  auVar53._0_4_ = auVar70._4_4_;
  auVar53._8_4_ = auVar70._12_4_;
  auVar53._12_4_ = auVar70._8_4_;
  auVar68 = maxps(auVar53,auVar70);
  auVar124._0_8_ = auVar68._8_8_;
  auVar124._8_4_ = auVar68._0_4_;
  auVar124._12_4_ = auVar68._4_4_;
  auVar70 = maxps(auVar124,auVar68);
  auVar54._8_4_ = local_11e8._8_4_;
  auVar54._0_8_ = local_11e8._0_8_;
  auVar54._12_4_ = local_11e8._12_4_;
  auVar68 = blendvps(_DAT_01f7aa00,auVar130,auVar54);
  auVar71._4_4_ = auVar68._0_4_;
  auVar71._0_4_ = auVar68._4_4_;
  auVar71._8_4_ = auVar68._12_4_;
  auVar71._12_4_ = auVar68._8_4_;
  auVar68 = maxps(auVar71,auVar68);
  auVar107._0_8_ = auVar68._8_8_;
  auVar107._8_4_ = auVar68._0_4_;
  auVar107._12_4_ = auVar68._4_4_;
  auVar68 = maxps(auVar107,auVar68);
  auVar106 = insertps(auVar70,auVar68,0x1c);
  auVar12._4_4_ = fVar125;
  auVar12._0_4_ = fVar121;
  auVar12._8_4_ = fVar127;
  auVar12._12_4_ = fVar129;
  auVar68 = blendvps(_DAT_01f7aa00,auVar12,auVar54);
  auVar72._4_4_ = auVar68._0_4_;
  auVar72._0_4_ = auVar68._4_4_;
  auVar72._8_4_ = auVar68._12_4_;
  auVar72._12_4_ = auVar68._8_4_;
  auVar68 = maxps(auVar72,auVar68);
  auVar108._0_8_ = auVar68._8_8_;
  auVar108._8_4_ = auVar68._0_4_;
  auVar108._12_4_ = auVar68._4_4_;
  auVar68 = maxps(auVar108,auVar68);
  auVar70 = blendvps(_DAT_01f7a9f0,auVar67,auVar54);
  auVar134 = insertps(auVar106,auVar68,0x20);
  auVar73._4_4_ = auVar70._0_4_;
  auVar73._0_4_ = auVar70._4_4_;
  auVar73._8_4_ = auVar70._12_4_;
  auVar73._12_4_ = auVar70._8_4_;
  auVar68 = minps(auVar73,auVar70);
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01f7aa00,local_10f8,auVar54);
  auVar109._4_4_ = bi_9.field_0._0_4_;
  auVar109._0_4_ = bi_9.field_0._4_4_;
  auVar109._8_4_ = bi_9.field_0._12_4_;
  auVar109._12_4_ = bi_9.field_0._8_4_;
  auVar55._4_4_ = -(uint)(0.0 <= auVar132._4_4_);
  auVar55._0_4_ = -(uint)(0.0 <= auVar132._0_4_);
  auVar55._8_4_ = -(uint)(0.0 <= auVar132._8_4_);
  auVar55._12_4_ = -(uint)(0.0 <= auVar132._12_4_);
  auVar106 = blendvps(auVar134,auVar132,auVar55);
  auVar70 = blendvps(auVar123,auVar33,auVar55);
  auVar33 = blendvps(auVar33,auVar123,auVar55);
  local_fe8 = auVar106._0_4_;
  local_1008 = auVar106._4_4_;
  auVar123 = maxps(auVar109,(undefined1  [16])bi_9.field_0);
  uVar30 = (ulong)(local_1008 < 0.0) << 4 | 0x20;
  fStack_fc0 = auVar106._8_4_;
  uVar23 = (ulong)(fStack_fc0 < 0.0) << 4 | 0x40;
  uVar31 = uVar30 ^ 0x10;
  auVar106 = blendvps(auVar132,auVar134,auVar55);
  local_ff8 = auVar70._0_4_ * local_fe8;
  local_1018 = auVar70._4_4_ * local_1008;
  local_fd8 = auVar70._8_4_ * fStack_fc0;
  local_11d8 = auVar33._0_4_;
  fStack_11d4 = auVar33._4_4_;
  fStack_11d0 = auVar33._8_4_;
  local_1028 = auVar106._0_4_;
  local_1038 = local_11d8 * local_1028;
  local_1048 = auVar106._4_4_;
  fStack_11d4 = fStack_11d4 * local_1048;
  fStack_fa0 = auVar106._8_4_;
  fStack_11d0 = fStack_11d0 * fStack_fa0;
  uVar28 = (ulong)(local_fe8 < 0.0) * 0x10;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  local_fc8._4_4_ = fStack_fc0;
  local_fc8._0_4_ = fStack_fc0;
  fStack_fbc = fStack_fc0;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_11c8 = auVar68._0_4_;
  iStack_11c0 = auVar68._8_4_;
  auVar56._4_4_ = local_11c8;
  auVar56._0_4_ = local_11c8;
  auVar56._8_4_ = local_11c8;
  auVar56._12_4_ = local_11c8;
  auVar74._4_4_ = iStack_11c0;
  auVar74._0_4_ = iStack_11c0;
  auVar74._8_4_ = iStack_11c0;
  auVar74._12_4_ = iStack_11c0;
  auVar68 = minps(auVar74,auVar56);
  uVar24 = auVar123._0_4_;
  auVar110._8_4_ = auVar123._8_4_;
  auVar57._4_4_ = uVar24;
  auVar57._0_4_ = uVar24;
  auVar57._8_4_ = uVar24;
  auVar57._12_4_ = uVar24;
  auVar110._4_4_ = auVar110._8_4_;
  auVar110._0_4_ = auVar110._8_4_;
  auVar110._12_4_ = auVar110._8_4_;
  local_fb8 = maxps(auVar110,auVar57);
  local_f98 = blendvps(_DAT_01f7a9f0,auVar67,local_11e8);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  local_1058._4_4_ = fStack_11d4;
  local_1058._0_4_ = fStack_11d4;
  fStack_1050 = fStack_11d4;
  fStack_104c = fStack_11d4;
  local_fa8._4_4_ = fStack_fa0;
  local_fa8._0_4_ = fStack_fa0;
  fStack_f9c = fStack_fa0;
  uVar15 = movmskps((int)pBVar19,local_1088);
  uVar17 = (ulong)uVar15;
  this = pBVar25;
  local_1138 = stack + 1;
LAB_00295129:
  uVar17 = ~uVar17;
  while (pSVar29 = local_1138 + -1, (local_1138[-1].mask & uVar17) != 0) {
    uVar22 = (pSVar29->ptr).ptr;
    uVar21 = uVar22;
    if ((uVar22 & 8) != 0) {
LAB_00295339:
      pBVar18 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                 *)((ulong)((uint)uVar22 & 0xf) - 8);
      pBVar19 = pBVar18;
      auVar70 = local_1088;
      if (pBVar18 ==
          (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
           *)0x0) goto LAB_002954dd;
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      local_1068 = local_1088 ^ auVar4;
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
              *)0x1;
      goto LAB_0029536b;
    }
    while( true ) {
      pfVar1 = (float *)(uVar21 + 0x20 + uVar28);
      fVar96 = *pfVar1 * local_fe8 - local_ff8;
      fVar101 = pfVar1[1] * fStack_fe4 - fStack_ff4;
      fVar116 = pfVar1[2] * fStack_fe0 - fStack_ff0;
      fVar119 = pfVar1[3] * fStack_fdc - fStack_fec;
      pfVar1 = (float *)(uVar21 + 0x20 + uVar30);
      fVar64 = *pfVar1 * local_1008 - local_1018;
      fVar76 = pfVar1[1] * fStack_1004 - fStack_1014;
      fVar79 = pfVar1[2] * fStack_1000 - fStack_1010;
      fVar82 = pfVar1[3] * fStack_ffc - fStack_100c;
      uVar65 = (uint)((int)fVar64 < (int)fVar96) * (int)fVar96 |
               (uint)((int)fVar64 >= (int)fVar96) * (int)fVar64;
      uVar77 = (uint)((int)fVar76 < (int)fVar101) * (int)fVar101 |
               (uint)((int)fVar76 >= (int)fVar101) * (int)fVar76;
      uVar80 = (uint)((int)fVar79 < (int)fVar116) * (int)fVar116 |
               (uint)((int)fVar79 >= (int)fVar116) * (int)fVar79;
      uVar83 = (uint)((int)fVar82 < (int)fVar119) * (int)fVar119 |
               (uint)((int)fVar82 >= (int)fVar119) * (int)fVar82;
      pfVar1 = (float *)(uVar21 + 0x20 + uVar23);
      fVar96 = *pfVar1 * (float)local_fc8._0_4_ - local_fd8;
      fVar101 = pfVar1[1] * (float)local_fc8._4_4_ - fStack_fd4;
      fVar116 = pfVar1[2] * fStack_fc0 - fStack_fd0;
      fVar119 = pfVar1[3] * fStack_fbc - fStack_fcc;
      local_11c8 = auVar68._0_4_;
      iStack_11c4 = auVar68._4_4_;
      iStack_11c0 = auVar68._8_4_;
      iStack_11bc = auVar68._12_4_;
      uVar15 = (uint)((int)fVar96 < local_11c8) * local_11c8 |
               (uint)((int)fVar96 >= local_11c8) * (int)fVar96;
      uVar61 = (uint)((int)fVar101 < iStack_11c4) * iStack_11c4 |
               (uint)((int)fVar101 >= iStack_11c4) * (int)fVar101;
      uVar62 = (uint)((int)fVar116 < iStack_11c0) * iStack_11c0 |
               (uint)((int)fVar116 >= iStack_11c0) * (int)fVar116;
      uVar63 = (uint)((int)fVar119 < iStack_11bc) * iStack_11bc |
               (uint)((int)fVar119 >= iStack_11bc) * (int)fVar119;
      pfVar1 = (float *)(uVar21 + 0x20 + (uVar28 ^ 0x10));
      fVar96 = *pfVar1 * local_1028 - local_1038;
      fVar101 = pfVar1[1] * fStack_1024 - fStack_1034;
      fVar116 = pfVar1[2] * fStack_1020 - fStack_1030;
      fVar119 = pfVar1[3] * fStack_101c - fStack_102c;
      pfVar1 = (float *)(uVar21 + 0x20 + uVar31);
      fVar64 = *pfVar1 * local_1048 - (float)local_1058._0_4_;
      fVar76 = pfVar1[1] * fStack_1044 - (float)local_1058._4_4_;
      fVar79 = pfVar1[2] * fStack_1040 - fStack_1050;
      fVar82 = pfVar1[3] * fStack_103c - fStack_104c;
      uVar86 = (uint)((int)fVar96 < (int)fVar64) * (int)fVar96 |
               (uint)((int)fVar96 >= (int)fVar64) * (int)fVar64;
      uVar97 = (uint)((int)fVar101 < (int)fVar76) * (int)fVar101 |
               (uint)((int)fVar101 >= (int)fVar76) * (int)fVar76;
      uVar99 = (uint)((int)fVar116 < (int)fVar79) * (int)fVar116 |
               (uint)((int)fVar116 >= (int)fVar79) * (int)fVar79;
      uVar102 = (uint)((int)fVar119 < (int)fVar82) * (int)fVar119 |
                (uint)((int)fVar119 >= (int)fVar82) * (int)fVar82;
      pfVar1 = (float *)(uVar21 + 0x20 + (uVar23 ^ 0x10));
      fVar96 = *pfVar1 * (float)local_fa8._0_4_ - fStack_11d0;
      fVar101 = pfVar1[1] * (float)local_fa8._4_4_ - fStack_11d0;
      fVar116 = pfVar1[2] * fStack_fa0 - fStack_11d0;
      fVar119 = pfVar1[3] * fStack_f9c - fStack_11d0;
      uVar66 = (uint)((int)local_fb8._0_4_ < (int)fVar96) * local_fb8._0_4_ |
               (uint)((int)local_fb8._0_4_ >= (int)fVar96) * (int)fVar96;
      uVar78 = (uint)((int)local_fb8._4_4_ < (int)fVar101) * local_fb8._4_4_ |
               (uint)((int)local_fb8._4_4_ >= (int)fVar101) * (int)fVar101;
      uVar81 = (uint)((int)local_fb8._8_4_ < (int)fVar116) * local_fb8._8_4_ |
               (uint)((int)local_fb8._8_4_ >= (int)fVar116) * (int)fVar116;
      uVar84 = (uint)((int)local_fb8._12_4_ < (int)fVar119) * local_fb8._12_4_ |
               (uint)((int)local_fb8._12_4_ >= (int)fVar119) * (int)fVar119;
      auVar58._4_4_ =
           -(uint)((float)(((int)uVar61 < (int)uVar77) * uVar77 |
                          ((int)uVar61 >= (int)uVar77) * uVar61) <=
                  (float)(((int)uVar97 < (int)uVar78) * uVar97 |
                         ((int)uVar97 >= (int)uVar78) * uVar78));
      auVar58._0_4_ =
           -(uint)((float)(((int)uVar15 < (int)uVar65) * uVar65 |
                          ((int)uVar15 >= (int)uVar65) * uVar15) <=
                  (float)(((int)uVar86 < (int)uVar66) * uVar86 |
                         ((int)uVar86 >= (int)uVar66) * uVar66));
      auVar58._8_4_ =
           -(uint)((float)(((int)uVar62 < (int)uVar80) * uVar80 |
                          ((int)uVar62 >= (int)uVar80) * uVar62) <=
                  (float)(((int)uVar99 < (int)uVar81) * uVar99 |
                         ((int)uVar99 >= (int)uVar81) * uVar81));
      auVar58._12_4_ =
           -(uint)((float)(((int)uVar63 < (int)uVar83) * uVar83 |
                          ((int)uVar63 >= (int)uVar83) * uVar63) <=
                  (float)(((int)uVar102 < (int)uVar84) * uVar102 |
                         ((int)uVar102 >= (int)uVar84) * uVar84));
      uVar15 = movmskps((int)uVar31,auVar58);
      if (uVar15 == 0) break;
      uVar27 = (ulong)(uVar15 & 0xff);
      local_1138 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x0;
      sVar26 = 8;
      do {
        lVar3 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        fVar96 = *(float *)(uVar21 + 0x20 + lVar3 * 4);
        fVar101 = *(float *)(uVar21 + 0x30 + lVar3 * 4);
        fVar116 = *(float *)(uVar21 + 0x40 + lVar3 * 4);
        fVar119 = *(float *)(uVar21 + 0x50 + lVar3 * 4);
        fVar87 = (fVar96 - fVar136) * fVar148;
        fVar98 = (fVar96 - fVar137) * fVar149;
        fVar100 = (fVar96 - fVar138) * fVar150;
        fVar103 = (fVar96 - fVar139) * fVar151;
        fVar104 = (fVar116 - fVar140) * auVar130._0_4_;
        fVar111 = (fVar116 - fVar141) * auVar130._4_4_;
        fVar112 = (fVar116 - fVar142) * auVar130._8_4_;
        fVar113 = (fVar116 - fVar143) * auVar130._12_4_;
        fVar96 = *(float *)(uVar21 + 0x60 + lVar3 * 4);
        fVar114 = (fVar96 - fVar144) * fVar121;
        fVar117 = (fVar96 - fVar145) * fVar125;
        fVar118 = (fVar96 - fVar146) * fVar127;
        fVar120 = (fVar96 - fVar147) * fVar129;
        fVar76 = (fVar101 - fVar136) * fVar148;
        fVar79 = (fVar101 - fVar137) * fVar149;
        fVar82 = (fVar101 - fVar138) * fVar150;
        fVar85 = (fVar101 - fVar139) * fVar151;
        fVar101 = (fVar119 - fVar140) * auVar130._0_4_;
        fVar116 = (fVar119 - fVar141) * auVar130._4_4_;
        fVar64 = (fVar119 - fVar142) * auVar130._8_4_;
        fVar119 = (fVar119 - fVar143) * auVar130._12_4_;
        fVar96 = *(float *)(uVar21 + 0x70 + lVar3 * 4);
        fVar122 = (fVar96 - fVar144) * fVar121;
        fVar126 = (fVar96 - fVar145) * fVar125;
        fVar128 = (fVar96 - fVar146) * fVar127;
        fVar96 = (fVar96 - fVar147) * fVar129;
        uVar15 = (uint)((int)fVar76 < (int)fVar87) * (int)fVar76 |
                 (uint)((int)fVar76 >= (int)fVar87) * (int)fVar87;
        uVar61 = (uint)((int)fVar79 < (int)fVar98) * (int)fVar79 |
                 (uint)((int)fVar79 >= (int)fVar98) * (int)fVar98;
        uVar62 = (uint)((int)fVar82 < (int)fVar100) * (int)fVar82 |
                 (uint)((int)fVar82 >= (int)fVar100) * (int)fVar100;
        uVar63 = (uint)((int)fVar85 < (int)fVar103) * (int)fVar85 |
                 (uint)((int)fVar85 >= (int)fVar103) * (int)fVar103;
        uVar65 = (uint)((int)fVar101 < (int)fVar104) * (int)fVar101 |
                 (uint)((int)fVar101 >= (int)fVar104) * (int)fVar104;
        uVar66 = (uint)((int)fVar116 < (int)fVar111) * (int)fVar116 |
                 (uint)((int)fVar116 >= (int)fVar111) * (int)fVar111;
        uVar77 = (uint)((int)fVar64 < (int)fVar112) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar112) * (int)fVar112;
        uVar78 = (uint)((int)fVar119 < (int)fVar113) * (int)fVar119 |
                 (uint)((int)fVar119 >= (int)fVar113) * (int)fVar113;
        uVar86 = ((int)uVar65 < (int)uVar15) * uVar15 | ((int)uVar65 >= (int)uVar15) * uVar65;
        uVar97 = ((int)uVar66 < (int)uVar61) * uVar61 | ((int)uVar66 >= (int)uVar61) * uVar66;
        uVar99 = ((int)uVar77 < (int)uVar62) * uVar62 | ((int)uVar77 >= (int)uVar62) * uVar77;
        uVar102 = ((int)uVar78 < (int)uVar63) * uVar63 | ((int)uVar78 >= (int)uVar63) * uVar78;
        uVar15 = (uint)((int)fVar122 < (int)fVar114) * (int)fVar122 |
                 (uint)((int)fVar122 >= (int)fVar114) * (int)fVar114;
        uVar61 = (uint)((int)fVar126 < (int)fVar117) * (int)fVar126 |
                 (uint)((int)fVar126 >= (int)fVar117) * (int)fVar117;
        uVar62 = (uint)((int)fVar128 < (int)fVar118) * (int)fVar128 |
                 (uint)((int)fVar128 >= (int)fVar118) * (int)fVar118;
        uVar63 = (uint)((int)fVar96 < (int)fVar120) * (int)fVar96 |
                 (uint)((int)fVar96 >= (int)fVar120) * (int)fVar120;
        uVar80 = (uint)((int)uVar15 < (int)local_f98._0_4_) * local_f98._0_4_ |
                 ((int)uVar15 >= (int)local_f98._0_4_) * uVar15;
        uVar81 = (uint)((int)uVar61 < (int)local_f98._4_4_) * local_f98._4_4_ |
                 ((int)uVar61 >= (int)local_f98._4_4_) * uVar61;
        uVar83 = (uint)((int)uVar62 < (int)local_f98._8_4_) * local_f98._8_4_ |
                 ((int)uVar62 >= (int)local_f98._8_4_) * uVar62;
        uVar84 = (uint)((int)uVar63 < (int)local_f98._12_4_) * local_f98._12_4_ |
                 ((int)uVar63 >= (int)local_f98._12_4_) * uVar63;
        uVar65 = (uint)((int)fVar76 < (int)fVar87) * (int)fVar87 |
                 (uint)((int)fVar76 >= (int)fVar87) * (int)fVar76;
        uVar66 = (uint)((int)fVar79 < (int)fVar98) * (int)fVar98 |
                 (uint)((int)fVar79 >= (int)fVar98) * (int)fVar79;
        uVar77 = (uint)((int)fVar82 < (int)fVar100) * (int)fVar100 |
                 (uint)((int)fVar82 >= (int)fVar100) * (int)fVar82;
        uVar78 = (uint)((int)fVar85 < (int)fVar103) * (int)fVar103 |
                 (uint)((int)fVar85 >= (int)fVar103) * (int)fVar85;
        uVar15 = (uint)((int)fVar101 < (int)fVar104) * (int)fVar104 |
                 (uint)((int)fVar101 >= (int)fVar104) * (int)fVar101;
        uVar61 = (uint)((int)fVar116 < (int)fVar111) * (int)fVar111 |
                 (uint)((int)fVar116 >= (int)fVar111) * (int)fVar116;
        uVar62 = (uint)((int)fVar64 < (int)fVar112) * (int)fVar112 |
                 (uint)((int)fVar64 >= (int)fVar112) * (int)fVar64;
        uVar63 = (uint)((int)fVar119 < (int)fVar113) * (int)fVar113 |
                 (uint)((int)fVar119 >= (int)fVar113) * (int)fVar119;
        uVar15 = ((int)uVar65 < (int)uVar15) * uVar65 | ((int)uVar65 >= (int)uVar15) * uVar15;
        uVar61 = ((int)uVar66 < (int)uVar61) * uVar66 | ((int)uVar66 >= (int)uVar61) * uVar61;
        uVar62 = ((int)uVar77 < (int)uVar62) * uVar77 | ((int)uVar77 >= (int)uVar62) * uVar62;
        uVar63 = ((int)uVar78 < (int)uVar63) * uVar78 | ((int)uVar78 >= (int)uVar63) * uVar63;
        uVar65 = (uint)((int)fVar122 < (int)fVar114) * (int)fVar114 |
                 (uint)((int)fVar122 >= (int)fVar114) * (int)fVar122;
        uVar66 = (uint)((int)fVar126 < (int)fVar117) * (int)fVar117 |
                 (uint)((int)fVar126 >= (int)fVar117) * (int)fVar126;
        uVar77 = (uint)((int)fVar128 < (int)fVar118) * (int)fVar118 |
                 (uint)((int)fVar128 >= (int)fVar118) * (int)fVar128;
        uVar78 = (uint)((int)fVar96 < (int)fVar120) * (int)fVar120 |
                 (uint)((int)fVar96 >= (int)fVar120) * (int)fVar96;
        uVar65 = (uint)(bi_9.field_0.i[0] < (int)uVar65) * bi_9.field_0.i[0] |
                 (bi_9.field_0.i[0] >= (int)uVar65) * uVar65;
        uVar66 = (uint)(bi_9.field_0.i[1] < (int)uVar66) * bi_9.field_0.i[1] |
                 (bi_9.field_0.i[1] >= (int)uVar66) * uVar66;
        uVar77 = (uint)(bi_9.field_0.i[2] < (int)uVar77) * bi_9.field_0.i[2] |
                 (bi_9.field_0.i[2] >= (int)uVar77) * uVar77;
        uVar78 = (uint)(bi_9.field_0.i[3] < (int)uVar78) * bi_9.field_0.i[3] |
                 (bi_9.field_0.i[3] >= (int)uVar78) * uVar78;
        auVar133._4_4_ =
             -(uint)((float)(((int)uVar81 < (int)uVar97) * uVar97 |
                            ((int)uVar81 >= (int)uVar97) * uVar81) <=
                    (float)(((int)uVar61 < (int)uVar66) * uVar61 |
                           ((int)uVar61 >= (int)uVar66) * uVar66));
        auVar133._0_4_ =
             -(uint)((float)(((int)uVar80 < (int)uVar86) * uVar86 |
                            ((int)uVar80 >= (int)uVar86) * uVar80) <=
                    (float)(((int)uVar15 < (int)uVar65) * uVar15 |
                           ((int)uVar15 >= (int)uVar65) * uVar65));
        auVar133._8_4_ =
             -(uint)((float)(((int)uVar83 < (int)uVar99) * uVar99 |
                            ((int)uVar83 >= (int)uVar99) * uVar83) <=
                    (float)(((int)uVar62 < (int)uVar77) * uVar62 |
                           ((int)uVar62 >= (int)uVar77) * uVar77));
        auVar133._12_4_ =
             -(uint)((float)(((int)uVar84 < (int)uVar102) * uVar102 |
                            ((int)uVar84 >= (int)uVar102) * uVar84) <=
                    (float)(((int)uVar63 < (int)uVar78) * uVar63 |
                           ((int)uVar63 >= (int)uVar78) * uVar78));
        uVar15 = movmskps((int)context,auVar133);
        context = (RayQueryContext *)(ulong)uVar15;
        uVar22 = sVar26;
        if (uVar15 != 0) {
          uVar22 = *(ulong *)(uVar21 + lVar3 * 8);
          if (sVar26 != 8) {
            (pSVar29->ptr).ptr = sVar26;
            pSVar29->mask = (size_t)local_1138;
            pSVar29 = pSVar29 + 1;
          }
          local_1138 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)((ulong)context & 0xff);
        }
        this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                *)(uVar27 - 1);
        uVar27 = uVar27 & (ulong)this;
        sVar26 = uVar22;
      } while (uVar27 != 0);
      if (uVar22 == 8) break;
      uVar21 = uVar22;
      if ((uVar22 & 8) != 0) {
        if (local_1138 == (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x0) goto LAB_00295506;
        goto LAB_00295339;
      }
    }
    local_1138 = pSVar29;
    if (local_1138 == stack) goto LAB_00295521;
  }
  goto LAB_00295506;
  while( true ) {
    pBVar19 = this + 1;
    local_1068._4_4_ = uVar61;
    local_1068._0_4_ = uVar15;
    local_1068._8_4_ = auVar59._8_4_;
    local_1068._12_4_ = auVar59._12_4_;
    bVar32 = pBVar18 <= this;
    this = pBVar19;
    if (bVar32) break;
LAB_0029536b:
    local_1124 = *(uint *)(((uVar22 & 0xfffffffffffffff0) - 8) + (long)this * 8);
    context = (RayQueryContext *)(ulong)local_1124;
    local_1120 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (long)context * 8);
    uVar15 = *(uint *)(local_1120 + 0x34);
    auVar75._0_4_ = -(uint)((uVar15 & *(uint *)&(This->intersector8).occluded) == 0);
    auVar75._4_4_ = -(uint)((uVar15 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
    auVar75._8_4_ = -(uint)((uVar15 & *(uint *)&(This->intersector8).name) == 0);
    auVar75._12_4_ = -(uint)((uVar15 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar75 & local_1068);
    uVar65 = movmskps((int)local_1138,(undefined1  [16])mask.field_0);
    local_1138 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)(ulong)uVar65;
    uVar15 = local_1078;
    uVar61 = uStack_1074;
    uVar62 = uStack_1070;
    uVar63 = uStack_106c;
    if (uVar65 != 0) {
      local_1140 = *(undefined4 *)(((uVar22 & 0xfffffffffffffff0) - 4) + (long)this * 8);
      local_1150 = &mask;
      local_1148 = *(undefined8 *)(local_1120 + 0x18);
      local_1138 = *(StackItemMaskT<embree::NodeRefPtr<4>_> **)(ray + 8);
      local_1128 = 4;
      local_1118 = 0;
      local_1110 = *(long *)(ray + 0x10);
      pcVar20 = *(code **)(local_1110 + 0x18);
      if (pcVar20 == (code *)0x0) {
        pcVar20 = *(code **)(local_1120 + 0x68);
      }
      local_1130 = This;
      local_1120 = (*pcVar20)(&local_1150);
      uVar15 = -(uint)(*(float *)&(This->intersector4_nofilter).name < 0.0);
      uVar61 = -(uint)(*(float *)((long)&(This->intersector4_nofilter).name + 4) < 0.0);
      uVar62 = -(uint)(*(float *)&(This->intersector8).intersect < 0.0);
      uVar63 = -(uint)(*(float *)((long)&(This->intersector8).intersect + 4) < 0.0);
      auVar130 = local_10e8;
      auVar70 = local_1088;
      fVar136 = local_1098;
      fVar137 = fStack_1094;
      fVar138 = fStack_1090;
      fVar139 = fStack_108c;
      fVar140 = local_10a8;
      fVar141 = fStack_10a4;
      fVar142 = fStack_10a0;
      fVar143 = fStack_109c;
      fVar144 = local_10b8;
      fVar145 = fStack_10b4;
      fVar146 = fStack_10b0;
      fVar147 = fStack_10ac;
      fVar121 = local_10c8;
      fVar125 = fStack_10c4;
      fVar127 = fStack_10c0;
      fVar129 = fStack_10bc;
      fVar148 = local_10d8;
      fVar149 = fStack_10d4;
      fVar150 = fStack_10d0;
      fVar151 = fStack_10cc;
    }
    uVar15 = ~uVar15 & local_1068._0_4_;
    uVar61 = ~uVar61 & local_1068._4_4_;
    auVar59._0_8_ = CONCAT44(uVar61,uVar15);
    auVar59._8_4_ = ~uVar62 & local_1068._8_4_;
    auVar59._12_4_ = ~uVar63 & local_1068._12_4_;
    iVar16 = movmskps((int)local_1120,auVar59);
    pBVar19 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
               *)CONCAT44((int)((ulong)local_1120 >> 0x20),iVar16);
    if (iVar16 == 0) break;
  }
  local_1088._0_8_ = auVar59._0_8_ ^ 0xffffffffffffffff;
  local_1088._8_4_ = auVar59._8_4_ ^ 0xffffffff;
  local_1088._12_4_ = auVar59._12_4_ ^ 0xffffffff;
LAB_002954dd:
  local_1088 = auVar70 | local_1088;
  local_11e8._0_4_ = ~local_1088._0_4_ & local_11e8._0_4_;
  local_11e8._4_4_ = ~local_1088._4_4_ & local_11e8._4_4_;
  local_11e8._8_4_ = ~local_1088._8_4_ & local_11e8._8_4_;
  local_11e8._12_4_ = ~local_1088._12_4_ & local_11e8._12_4_;
  iVar16 = movmskps((int)pBVar19,local_11e8);
  uVar17 = CONCAT44((int)((ulong)pBVar19 >> 0x20),iVar16);
  if (iVar16 == 0) goto LAB_00295521;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps((undefined1  [16])bi_9.field_0,_DAT_01f7aa00,local_1088);
LAB_00295506:
  uVar24 = movmskps((int)uVar17,local_1088);
  uVar17 = CONCAT44((int)(uVar17 >> 0x20),uVar24);
  local_1138 = pSVar29;
  if (pSVar29 == stack) goto LAB_00295521;
  goto LAB_00295129;
LAB_00295521:
  pBVar19 = pBVar25;
  if (pBVar25 ==
      (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
       *)0x0) {
    auVar60._0_4_ = -(uint)(local_1108 == -1);
    auVar60._4_4_ = -(uint)(iStack_1104 == -1);
    auVar60._8_4_ = -(uint)(iStack_1100 == -1);
    auVar60._12_4_ = -(uint)(iStack_10fc == -1);
    auVar68 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa00,
                       auVar60 & local_1088);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar68;
    return;
  }
  goto LAB_00294d36;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }